

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5UnicodeCreate(void *pUnused,char **azArg,int nArg,Fts5Tokenizer **ppOut)

{
  int iVar1;
  void *pvVar2;
  undefined8 *in_RCX;
  int in_EDX;
  Unicode61Tokenizer *in_RSI;
  char *zArg;
  int i;
  char *zCat;
  Unicode61Tokenizer *p;
  int rc;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined6 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  Unicode61Tokenizer *in_stack_ffffffffffffffb8;
  char *pcVar3;
  int local_3c;
  void *local_30;
  int local_24;
  undefined4 in_stack_ffffffffffffffe8;
  
  local_24 = 0;
  if (in_EDX % 2 == 0) {
    local_30 = sqlite3_malloc(in_stack_ffffffffffffffac);
    if (local_30 == (void *)0x0) {
      local_24 = 7;
    }
    else {
      memset(local_30,0,0xc0);
      *(undefined4 *)((long)local_30 + 0x8c) = 1;
      *(undefined4 *)((long)local_30 + 0x88) = 0x40;
      pvVar2 = sqlite3_malloc64(CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      *(void **)((long)local_30 + 0x80) = pvVar2;
      if (*(long *)((long)local_30 + 0x80) == 0) {
        local_24 = 7;
      }
      for (local_3c = 0; in_stack_ffffffffffffffb7 = local_24 == 0 && local_3c < in_EDX,
          local_24 == 0 && local_3c < in_EDX; local_3c = local_3c + 2) {
        sqlite3_stricmp((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                        (char *)0x28f3bb);
      }
      if (local_24 == 0) {
        local_24 = unicodeSetCategories
                             (in_stack_ffffffffffffffb8,
                              (char *)CONCAT17(in_stack_ffffffffffffffb7,
                                               CONCAT16(in_stack_ffffffffffffffb6,
                                                        in_stack_ffffffffffffffb0)));
      }
      for (local_3c = 0; in_stack_ffffffffffffffb6 = local_24 == 0 && local_3c < in_EDX,
          local_24 == 0 && local_3c < in_EDX; local_3c = local_3c + 2) {
        pcVar3 = *(char **)(in_RSI->aTokenChar + (long)(local_3c + 1) * 8);
        iVar1 = sqlite3_stricmp((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8
                                                ),(char *)0x28f467);
        if (iVar1 == 0) {
          if ((((*pcVar3 == '0') || (*pcVar3 == '1')) || (*pcVar3 == '2')) && (pcVar3[1] == '\0')) {
            *(int *)((long)local_30 + 0x8c) = *pcVar3 + -0x30;
          }
          else {
            local_24 = 1;
          }
        }
        else {
          iVar1 = sqlite3_stricmp((char *)CONCAT44(in_stack_ffffffffffffffac,
                                                   in_stack_ffffffffffffffa8),(char *)0x28f4e3);
          if (iVar1 == 0) {
            local_24 = fts5UnicodeAddExceptions
                                 (in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                                  (int)((ulong)in_RCX >> 0x20));
          }
          else {
            iVar1 = sqlite3_stricmp((char *)CONCAT44(in_stack_ffffffffffffffac,
                                                     in_stack_ffffffffffffffa8),(char *)0x28f51f);
            if (iVar1 == 0) {
              local_24 = fts5UnicodeAddExceptions
                                   (in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                                    (int)((ulong)in_RCX >> 0x20));
            }
            else {
              iVar1 = sqlite3_stricmp((char *)CONCAT44(in_stack_ffffffffffffffac,
                                                       in_stack_ffffffffffffffa8),(char *)0x28f558);
              if (iVar1 != 0) {
                local_24 = 1;
              }
            }
          }
        }
      }
    }
    if (local_24 != 0) {
      fts5UnicodeDelete((Fts5Tokenizer *)
                        CONCAT17(in_stack_ffffffffffffffb7,
                                 CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)));
      local_30 = (void *)0x0;
    }
    *in_RCX = local_30;
  }
  else {
    local_24 = 1;
  }
  return local_24;
}

Assistant:

static int fts5UnicodeCreate(
  void *pUnused,
  const char **azArg, int nArg,
  Fts5Tokenizer **ppOut
){
  int rc = SQLITE_OK;             /* Return code */
  Unicode61Tokenizer *p = 0;      /* New tokenizer object */

  UNUSED_PARAM(pUnused);

  if( nArg%2 ){
    rc = SQLITE_ERROR;
  }else{
    p = (Unicode61Tokenizer*)sqlite3_malloc(sizeof(Unicode61Tokenizer));
    if( p ){
      const char *zCat = "L* N* Co";
      int i;
      memset(p, 0, sizeof(Unicode61Tokenizer));

      p->eRemoveDiacritic = FTS5_REMOVE_DIACRITICS_SIMPLE;
      p->nFold = 64;
      p->aFold = sqlite3_malloc64(p->nFold * sizeof(char));
      if( p->aFold==0 ){
        rc = SQLITE_NOMEM;
      }

      /* Search for a "categories" argument */
      for(i=0; rc==SQLITE_OK && i<nArg; i+=2){
        if( 0==sqlite3_stricmp(azArg[i], "categories") ){
          zCat = azArg[i+1];
        }
      }
      if( rc==SQLITE_OK ){
        rc = unicodeSetCategories(p, zCat);
      }

      for(i=0; rc==SQLITE_OK && i<nArg; i+=2){
        const char *zArg = azArg[i+1];
        if( 0==sqlite3_stricmp(azArg[i], "remove_diacritics") ){
          if( (zArg[0]!='0' && zArg[0]!='1' && zArg[0]!='2') || zArg[1] ){
            rc = SQLITE_ERROR;
          }else{
            p->eRemoveDiacritic = (zArg[0] - '0');
            assert( p->eRemoveDiacritic==FTS5_REMOVE_DIACRITICS_NONE
                 || p->eRemoveDiacritic==FTS5_REMOVE_DIACRITICS_SIMPLE
                 || p->eRemoveDiacritic==FTS5_REMOVE_DIACRITICS_COMPLEX
            );
          }
        }else
        if( 0==sqlite3_stricmp(azArg[i], "tokenchars") ){
          rc = fts5UnicodeAddExceptions(p, zArg, 1);
        }else
        if( 0==sqlite3_stricmp(azArg[i], "separators") ){
          rc = fts5UnicodeAddExceptions(p, zArg, 0);
        }else
        if( 0==sqlite3_stricmp(azArg[i], "categories") ){
          /* no-op */
        }else{
          rc = SQLITE_ERROR;
        }
      }
    }else{
      rc = SQLITE_NOMEM;
    }
    if( rc!=SQLITE_OK ){
      fts5UnicodeDelete((Fts5Tokenizer*)p);
      p = 0;
    }
    *ppOut = (Fts5Tokenizer*)p;
  }
  return rc;
}